

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O3

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Class_Statements(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
                   *this,string *t_class_name)

{
  bool bVar1;
  ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
  *in_RAX;
  bool bVar2;
  bool bVar3;
  Depth_Counter dc;
  Depth_Counter local_28;
  
  local_28.parser = in_RAX;
  Depth_Counter::Depth_Counter(&local_28,this);
  bVar3 = false;
  do {
    do {
      do {
        bVar2 = bVar3;
        bVar1 = Def(this,true,t_class_name);
        bVar3 = true;
      } while (bVar1);
      bVar1 = Var_Decl(this,true,t_class_name);
    } while (bVar1);
    bVar1 = Eol(this);
  } while (bVar1);
  (local_28.parser)->m_current_parse_depth = (local_28.parser)->m_current_parse_depth - 1;
  return bVar2;
}

Assistant:

bool Class_Statements(const std::string &t_class_name) {
        Depth_Counter dc{this};
        bool retval = false;

        bool has_more = true;
        bool saw_eol = true;

        while (has_more) {
          const auto start = m_position;
          if (Def(true, t_class_name) || Var_Decl(true, t_class_name)) {
            if (!saw_eol) {
              throw exception::eval_error("Two function definitions missing line separator",
                                          File_Position(start.line, start.col),
                                          *m_filename);
            }
            has_more = true;
            retval = true;
            saw_eol = true;
          } else if (Eol()) {
            has_more = true;
            retval = true;
            saw_eol = true;
          } else {
            has_more = false;
          }
        }

        return retval;
      }